

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceImage::MemoryQualifierInstanceImage
          (MemoryQualifierInstanceImage *this,Context *context,string *name,ImageType imageType,
          UVec3 *imageSize,TextureFormat *format)

{
  TextureFormat *format_local;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  string *name_local;
  Context *context_local;
  MemoryQualifierInstanceImage *this_local;
  
  MemoryQualifierInstanceBase::MemoryQualifierInstanceBase
            (&this->super_MemoryQualifierInstanceBase,context,name,imageType,imageSize,format);
  (this->super_MemoryQualifierInstanceBase).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__MemoryQualifierInstanceImage_0166c278;
  de::details::MovePtr<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::MovePtr
            (&this->m_image);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imageView);
  return;
}

Assistant:

MemoryQualifierInstanceImage	(Context&					context,
														 const std::string&			name,
														 const ImageType			imageType,
														 const tcu::UVec3&			imageSize,
														 const tcu::TextureFormat&	format)
							: MemoryQualifierInstanceBase(context, name, imageType, imageSize, format) {}